

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duration.cc
# Opt level: O2

bool absl::lts_20250127::anon_unknown_1::IDivFastPath
               (Duration num,Duration den,int64_t *q,Duration *rem)

{
  ulong uVar1;
  uint32_t uVar2;
  HiRep HVar3;
  ulong uVar4;
  HiRep HVar5;
  uint uVar6;
  long lVar7;
  
  uVar2 = den.rep_lo_;
  HVar3 = den.rep_hi_;
  uVar6 = num.rep_lo_;
  HVar5 = num.rep_hi_;
  if (uVar2 == 0xffffffff || uVar6 == 0xffffffff) {
    return false;
  }
  if (HVar3 == (HiRep)0x0) {
    if (uVar2 == 4000000) {
      if (0x20c49ba5a64af6 < (ulong)HVar5) {
        return false;
      }
      uVar1 = (ulong)uVar6 / 4000000;
      uVar6 = uVar6 % 4000000;
      lVar7 = (long)HVar5 * 1000;
    }
    else if (uVar2 == 400) {
      if (0xd6bf94d454 < (ulong)HVar5) {
        return false;
      }
      uVar1 = (ulong)uVar6 / 400;
      uVar6 = uVar6 % 400;
      lVar7 = (long)HVar5 * 10000000;
    }
    else {
      if (uVar2 != 4000) {
        if (uVar2 != 4) {
          return false;
        }
        if (0x225c17c < (ulong)HVar5 >> 8) {
          return false;
        }
        *q = (ulong)(uVar6 >> 2) + (long)HVar5 * 1000000000;
        uVar6 = uVar6 & 3;
        goto LAB_00200fde;
      }
      if (0x8637bd04b55 < (ulong)HVar5) {
        return false;
      }
      uVar1 = (ulong)uVar6 / 4000;
      uVar6 = uVar6 % 4000;
      lVar7 = (long)HVar5 * 1000000;
    }
    HVar5.lo_ = 0;
    HVar5.hi_ = 0;
    *q = uVar1 + lVar7;
  }
  else {
    if (uVar2 != 0 || (long)HVar3 < 1) {
      return false;
    }
    if ((long)HVar5 < 0) {
      uVar1 = -((ulong)(uVar6 != 0) + (long)HVar5);
      uVar4 = uVar1 % (ulong)HVar3;
      HVar5 = (HiRep)~uVar4;
      if (uVar6 == 0) {
        HVar5 = (HiRep)-uVar4;
      }
      uVar1 = -(uVar1 / (ulong)HVar3);
    }
    else {
      if (HVar3 == (HiRep)0x1) {
        *q = (int64_t)HVar5;
LAB_00200fde:
        HVar5.lo_ = 0;
        HVar5.hi_ = 0;
        goto LAB_0020108c;
      }
      uVar1 = (ulong)HVar5 / (ulong)HVar3;
      HVar5 = (HiRep)((ulong)HVar5 % (ulong)HVar3);
    }
    *q = uVar1;
  }
LAB_0020108c:
  rem->rep_hi_ = HVar5;
  rem->rep_lo_ = uVar6;
  return true;
}

Assistant:

inline bool IDivFastPath(const Duration num, const Duration den, int64_t* q,
                         Duration* rem) {
  // Bail if num or den is an infinity.
  if (time_internal::IsInfiniteDuration(num) ||
      time_internal::IsInfiniteDuration(den))
    return false;

  int64_t num_hi = time_internal::GetRepHi(num);
  uint32_t num_lo = time_internal::GetRepLo(num);
  int64_t den_hi = time_internal::GetRepHi(den);
  uint32_t den_lo = time_internal::GetRepLo(den);

  if (den_hi == 0) {
    if (den_lo == kTicksPerNanosecond) {
      // Dividing by 1ns
      if (num_hi >= 0 && num_hi < (kint64max - kTicksPerSecond) / 1000000000) {
        *q = num_hi * 1000000000 + num_lo / kTicksPerNanosecond;
        *rem = time_internal::MakeDuration(0, num_lo % den_lo);
        return true;
      }
    } else if (den_lo == 100 * kTicksPerNanosecond) {
      // Dividing by 100ns (common when converting to Universal time)
      if (num_hi >= 0 && num_hi < (kint64max - kTicksPerSecond) / 10000000) {
        *q = num_hi * 10000000 + num_lo / (100 * kTicksPerNanosecond);
        *rem = time_internal::MakeDuration(0, num_lo % den_lo);
        return true;
      }
    } else if (den_lo == 1000 * kTicksPerNanosecond) {
      // Dividing by 1us
      if (num_hi >= 0 && num_hi < (kint64max - kTicksPerSecond) / 1000000) {
        *q = num_hi * 1000000 + num_lo / (1000 * kTicksPerNanosecond);
        *rem = time_internal::MakeDuration(0, num_lo % den_lo);
        return true;
      }
    } else if (den_lo == 1000000 * kTicksPerNanosecond) {
      // Dividing by 1ms
      if (num_hi >= 0 && num_hi < (kint64max - kTicksPerSecond) / 1000) {
        *q = num_hi * 1000 + num_lo / (1000000 * kTicksPerNanosecond);
        *rem = time_internal::MakeDuration(0, num_lo % den_lo);
        return true;
      }
    }
  } else if (den_hi > 0 && den_lo == 0) {
    // Dividing by positive multiple of 1s
    if (num_hi >= 0) {
      if (den_hi == 1) {
        *q = num_hi;
        *rem = time_internal::MakeDuration(0, num_lo);
        return true;
      }
      *q = num_hi / den_hi;
      *rem = time_internal::MakeDuration(num_hi % den_hi, num_lo);
      return true;
    }
    if (num_lo != 0) {
      num_hi += 1;
    }
    int64_t quotient = num_hi / den_hi;
    int64_t rem_sec = num_hi % den_hi;
    if (rem_sec > 0) {
      rem_sec -= den_hi;
      quotient += 1;
    }
    if (num_lo != 0) {
      rem_sec -= 1;
    }
    *q = quotient;
    *rem = time_internal::MakeDuration(rem_sec, num_lo);
    return true;
  }

  return false;
}